

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorstream.h
# Opt level: O0

int_type __thiscall
dlib::vectorstream::vector_streambuf::pbackfail(vector_streambuf *this,int_type c)

{
  ulong __n;
  size_type sVar1;
  byte *pbVar2;
  uint in_ESI;
  long in_RDI;
  unsigned_long prev;
  
  __n = *(long *)(in_RDI + 0x40) - 1;
  if (((in_ESI != 0xffffffff) &&
      (sVar1 = std::vector<char,_std::allocator<char>_>::size
                         (*(vector<char,_std::allocator<char>_> **)(in_RDI + 0x48)), __n < sVar1))
     && (pbVar2 = (byte *)std::vector<char,_std::allocator<char>_>::operator[]
                                    (*(vector<char,_std::allocator<char>_> **)(in_RDI + 0x48),__n),
        in_ESI != *pbVar2)) {
    return -1;
  }
  *(ulong *)(in_RDI + 0x40) = __n;
  return 1;
}

Assistant:

int_type pbackfail(
                int_type c
            )
            {  
                // if they are trying to push back a character that they didn't read last
                // that is an error
                const unsigned long prev = read_pos-1;
                if (c != EOF && prev < buffer.size() && 
                    c != static_cast<unsigned char>(buffer[prev]))
                {
                    return EOF;
                }

                read_pos = prev;
                return 1;
            }